

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O0

void __thiscall ServeStaticContent_Simple_Test::TestBody(ServeStaticContent_Simple_Test *this)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  **this_00;
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  const_reference ptVar4;
  type_conflict1 *ptVar5;
  UI_STRING *uis;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher;
  char *in_R9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff8f0;
  AssertHelper local_6a8;
  Message local_6a0;
  allocator local_691;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_1;
  Message local_658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_590;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_350;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_108 [8];
  error_or_n<std::string::size_type,_int> eo;
  anon_class_16_2_94b4847d record_headers;
  reader r;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  ServeStaticContent_Simple_Test *this_local;
  
  actual._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"/index.html",&local_59);
  anon_unknown.dwarf_a3877::ServeStaticContent::serve_path
            ((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38,&this->super_ServeStaticContent,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_81 = pstore::error_or::operator_cast_to_bool((error_or *)local_38);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_80,(AssertionResult *)"static_cast<bool> (actual)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  if (bVar2) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&r);
    ptVar4 = pstore::
             error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_38);
    this_00 = &record_headers.headers;
    anon_unknown.dwarf_a3877::reader::reader((reader *)this_00,(UI *)ptVar4,uis);
    eo._16_8_ = this_00;
    record_headers.r = &r;
    pstore::http::read_request<(anonymous_namespace)::reader>
              ((error_or_n<typename_reader::state_type,_request_info> *)&gtest_ar__1.message_,
               (reader *)this_00,0);
    pstore::operator>>=((error_or_n<typename_reader::state_type,_int> *)local_108,
                        (error_or_n<unsigned_long,_pstore::http::request_info> *)
                        &gtest_ar__1.message_,(anon_class_16_2_94b4847d *)&eo.has_error_);
    pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::~error_or
              ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
               &gtest_ar__1.message_);
    local_189 = pstore::error_or::operator_cast_to_bool((error_or *)local_108);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_188,&local_189,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar2) {
      testing::Message::Message(&local_198);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_188,
                 (AssertionResult *)"static_cast<bool> (eo)","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                 ,0x89,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (bVar2) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[15],_const_char_(&)[3],_true>
                (&local_510,(char (*) [15])"content-length",(char (*) [3])0x212613);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[13],_const_char_(&)[10],_true>
                (&local_550,(char (*) [13])"content-type",(char (*) [10])"text/html");
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[5],_const_char_(&)[1],_true>
                (&local_590,(char (*) [5])"date",(char (*) [1])0x21a96a);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_const_char_(&)[6],_true>
                (&local_5d0,(char (*) [11])"connection",(char (*) [6])0x216e69);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_const_char_(&)[30],_true>
                (&local_610,(char (*) [14])"last-modified",
                 (char (*) [30])"Tue, 23 Apr 2019 09:10:27 GMT");
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
                (&local_650,(char (*) [7])"server",(char (*) [12])"pstore-http");
      testing::
      UnorderedElementsAre<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>
                (&local_4d0,(testing *)&local_510,&local_550,&local_590,&local_5d0,&local_610,
                 &local_650,in_stack_fffffffffffff8f0);
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                (&local_350,(internal *)&local_4d0,matcher);
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
      ::operator()(local_1d0,(char *)&local_350,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)"headers");
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~PredicateFormatterFromMatcher(&local_350);
      testing::internal::
      UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~UnorderedElementsAreMatcher(&local_4d0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_650);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_610);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_5d0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_590);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_550);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_510);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar2) {
        testing::Message::Message(&local_658);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                   ,0x8f,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_658);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_658);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      ptVar4 = pstore::
               error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_38);
      ptVar5 = pstore::get<0ul,unsigned_long,int>((error_or_n<unsigned_long,_int> *)local_108);
      uVar1 = *ptVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_690,(string *)ptVar4,uVar1,&local_691);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
                ((EqHelper *)local_670,"(std::string{*actual, pstore::get<0> (eo)})","index_html",
                 &local_690,(char (*) [29])"<!DOCTYPE html><html></html>");
      std::__cxx11::string::~string((string *)&local_690);
      std::allocator<char>::~allocator((allocator<char> *)&local_691);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
      if (!bVar2) {
        testing::Message::Message(&local_6a0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
        testing::internal::AssertHelper::AssertHelper
                  (&local_6a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                   ,0x90,pcVar3);
        testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
        testing::internal::AssertHelper::~AssertHelper(&local_6a8);
        testing::Message::~Message(&local_6a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
    }
    pstore::error_or<std::tuple<unsigned_long,_int>_>::~error_or
              ((error_or<std::tuple<unsigned_long,_int>_> *)local_108);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&r);
  }
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38);
  return;
}

Assistant:

TEST_F (ServeStaticContent, Simple) {
    pstore::error_or<std::string> const actual = serve_path ("/index.html");
    ASSERT_TRUE (static_cast<bool> (actual));

    using string_pair = std::pair<std::string, std::string>;
    std::vector<string_pair> headers;

    reader r{*actual};
    auto const record_headers = [&r, &headers] (reader::state_type io,
                                                pstore::http::request_info const &) {
        auto record_header = [&headers] (int io2, std::string const & key,
                                         std::string const & value) {
            // The date value will change according to when the test is run so we preserve its
            // presence but drop its value.
            headers.emplace_back (key, (key == "date") ? "" : value);
            return io2 + 1;
        };

        return pstore::http::read_headers (r, io, record_header, 0);
    };

    pstore::error_or_n<std::string::size_type, int> const eo =
        pstore::http::read_request (r, std::string::size_type{0}) >>= record_headers;

    ASSERT_TRUE (static_cast<bool> (eo));
    EXPECT_THAT (headers,
                 ::testing::UnorderedElementsAre (
                     string_pair{"content-length", "28"}, string_pair{"content-type", "text/html"},
                     string_pair{"date", ""}, string_pair{"connection", "close"},
                     string_pair{"last-modified", "Tue, 23 Apr 2019 09:10:27 GMT"},
                     string_pair{"server", "pstore-http"}));
    EXPECT_EQ ((std::string{*actual, pstore::get<0> (eo)}), index_html);
}